

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

void Am_Animator_Interim_Do_proc(Am_Object *interp)

{
  unsigned_short uVar1;
  int value;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Value_List values;
  Am_Object_Method method;
  Am_Value_List AStack_58;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  pAVar2 = Am_Object::Get(interp,0xfa,0);
  Am_Value_List::Am_Value_List(&AStack_58,pAVar2);
  pAVar2 = Am_Object::Get(interp,0xfb,0);
  value = Am_Value::operator_cast_to_int(pAVar2);
  uVar1 = Am_Value_List::Length(&AStack_58);
  if (value < (int)(uVar1 - 1)) {
    value = value + 1;
    Am_Object::Set(interp,0xfb,value,0);
  }
  uVar1 = Am_Value_List::Length(&AStack_58);
  if (value < (int)(uVar1 - 1)) {
    Am_Object::Am_Object(&local_30,interp);
    Am_Stop_Timer(&local_30,0xe8);
    Am_Object::~Am_Object(&local_30);
    Am_Value_List::Move_Nth(&AStack_58,value);
    pAVar2 = Am_Value_List::Get(&AStack_58);
    Am_Object::Set(interp,0x181,pAVar2,0);
    Am_Value_List::Next(&AStack_58);
    pAVar2 = Am_Value_List::Get(&AStack_58);
    Am_Object::Set(interp,0x182,pAVar2,0);
    pAVar2 = Am_Object::Get(interp,199,0);
    Am_Object_Method::Am_Object_Method(&local_28,pAVar2);
    if (local_28.Call == (Am_Object_Method_Type *)0x0) goto LAB_00193fdc;
    Am_Object::Am_Object(&local_38,interp);
    (*local_28.Call)((Am_Object_Data *)&local_38);
    this = &local_38;
  }
  else {
    Am_Object::Am_Object(&local_40,interp);
    Am_Stop_Animator(&local_40);
    this = &local_40;
  }
  Am_Object::~Am_Object(this);
LAB_00193fdc:
  Am_Object::Am_Object(&local_48,interp);
  Am_Set_Animated_Slots(&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Value_List::~Am_Value_List(&AStack_58);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animator_Interim_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Animator Interim Do of " << interp);

  Am_Value_List values = interp.Get(Am_VALUES);
  int curr_phase = interp.Get(Am_CURRENT_PHASE);

  if (curr_phase < ((int)values.Length()) - 1) {
    ++curr_phase;
    interp.Set(Am_CURRENT_PHASE, curr_phase);
  }

  if (curr_phase < ((int)values.Length()) - 1) {
    Am_Stop_Timer(interp, Am_ANIMATION_METHOD);

    values.Move_Nth(curr_phase);
    interp.Set(Am_VALUE_1, values.Get());
    values.Next();
    interp.Set(Am_VALUE_2, values.Get());

    Am_Object_Method method = interp.Get(Am_START_DO_METHOD);
    if (method.Valid())
      method.Call(interp);
  } else {
    Am_Stop_Animator(interp);
  }

  Am_Set_Animated_Slots(interp);
}